

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::RaiseScope(cmMakefile *this,string *var,char *varDef)

{
  cmake *pcVar1;
  cmVariableWatch *this_00;
  bool bVar2;
  ostream *poVar3;
  string local_1b0;
  ostringstream m;
  
  if (var->_M_string_length != 0) {
    bVar2 = cmStateSnapshot::RaiseScope(&this->StateSnapshot,var,varDef);
    if (bVar2) {
      pcVar1 = this->GlobalGenerator->CMakeInstance;
      if ((pcVar1 != (cmake *)0x0) &&
         (this_00 = (pcVar1->VariableWatch)._M_t.
                    super___uniq_ptr_impl<cmVariableWatch,_std::default_delete<cmVariableWatch>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cmVariableWatch_*,_std::default_delete<cmVariableWatch>_>
                    .super__Head_base<0UL,_cmVariableWatch_*,_false>._M_head_impl,
         this_00 != (cmVariableWatch *)0x0)) {
        cmVariableWatch::VariableAccessed(this_00,var,3,varDef,this);
        return;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&m);
      poVar3 = std::operator<<((ostream *)&m,"Cannot set \"");
      poVar3 = std::operator<<(poVar3,(string *)var);
      std::operator<<(poVar3,"\": current scope has no parent.");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m);
    }
  }
  return;
}

Assistant:

void cmMakefile::UpdateOutputToSourceMap(std::string const& output,
                                         cmSourceFile* source)
{
  OutputToSourceMap::iterator i = this->OutputToSource.find(output);
  if (i != this->OutputToSource.end()) {
    // Multiple custom commands produce the same output but may
    // be attached to a different source file (MAIN_DEPENDENCY).
    // LinearGetSourceFileWithOutput would return the first one,
    // so keep the mapping for the first one.
    //
    // TODO: Warn the user about this case.  However, the VS 8 generator
    // triggers it for separate generate.stamp rules in ZERO_CHECK and
    // individual targets.
    return;
  }
  this->OutputToSource[output] = source;
}